

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool f_check(int m,int n)

{
  char *pcVar1;
  
  if (m < 1) {
    pcVar1 = "  M <= 0.\n";
  }
  else {
    if (0 < n) {
      return true;
    }
    pcVar1 = "  N <= 0.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"F_CHECK - Warning!\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,10);
  return false;
}

Assistant:

bool f_check ( int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_CHECK checks the parameters of the F PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    25 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the parameters of the PDF.
//    1 <= M,
//    1 <= N.
//
//    Output, bool F_CHECK, is true if the parameters are legal.
//
{
  if ( m <= 0 )
  {
    cerr << "\n";
    cerr << "F_CHECK - Warning!\n";
    cerr << "  M <= 0.\n";
    return false;
  }

  if ( n <= 0 )
  {
    cerr << "\n";
    cerr << "F_CHECK - Warning!\n";
    cerr << "  N <= 0.\n";
    return false;
  }

  return true;
}